

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel_solve.cpp
# Opt level: O0

void __thiscall Clasp::mt::ParallelSolve::SharedData::clearQueue(SharedData *this)

{
  bool bVar1;
  pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *ppVar2;
  PodQueue<const_bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>_*> *in_RDI;
  
  while (bVar1 = PodQueue<const_bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>_*>
                 ::empty(in_RDI), ((bVar1 ^ 0xffU) & 1) != 0) {
    ppVar2 = PodQueue<const_bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>_*>::
             pop_ret((PodQueue<const_bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>_*>
                      *)0x2217ed);
    if (ppVar2 != (pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *)0x0) {
      bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::~pod_vector
                ((pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *)0x221800);
      operator_delete(ppVar2);
    }
  }
  PodQueue<const_bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>_*>::clear
            (in_RDI);
  return;
}

Assistant:

void clearQueue() {
		while (!workQ.empty()) { delete workQ.pop_ret(); }
		workQ.clear();
	}